

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_FreeCString(JSContext *ctx,char *ptr)

{
  JSValue v;
  long in_RSI;
  JSString *p;
  
  if (in_RSI != 0) {
    v.tag = in_RSI;
    v.u.ptr = (void *)(in_RSI + -0x10);
    JS_FreeValue((JSContext *)0xfffffffffffffff9,v);
  }
  return;
}

Assistant:

void JS_FreeCString(JSContext *ctx, const char *ptr)
{
    JSString *p;
    if (!ptr)
        return;
    /* purposely removing constness */
    p = (JSString *)(void *)(ptr - offsetof(JSString, u));
    JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, p));
}